

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxInputManager.cpp
# Opt level: O0

void __thiscall OIS::LinuxInputManager::freeDeviceList_abi_cxx11_(LinuxInputManager *this)

{
  LinuxInputManager *in_stack_000000e8;
  
  freeDeviceList_abi_cxx11_(in_stack_000000e8);
  return;
}

Assistant:

DeviceList LinuxInputManager::freeDeviceList()
{
	DeviceList ret;

	if(window)
	{
		if(keyboardUsed == false)
			ret.insert(std::make_pair(OISKeyboard, mInputSystemName));

		if(mouseUsed == false)
			ret.insert(std::make_pair(OISMouse, mInputSystemName));
	}

	for(JoyStickInfoList::iterator i = unusedJoyStickList.begin(); i != unusedJoyStickList.end(); ++i)
		ret.insert(std::make_pair(OISJoyStick, i->vendor));

	return ret;
}